

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v6::internal::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  buffer<char> *pbVar11;
  uint *divisor;
  int iVar12;
  result rVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  size_t __len;
  uint64_t error;
  uint *puVar21;
  char cVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  uint64_t uVar26;
  boundaries bVar27;
  int exp;
  fixed_handler handler;
  int local_8c;
  buffer<char> *local_88;
  ulong local_80;
  ulong local_78;
  uint *local_70;
  double local_68;
  fp local_60;
  fixed_handler local_50;
  float_specs local_38;
  
  uVar14 = (ulong)(uint)precision;
  uVar25 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar25 == 0x200000000) {
      if (buf->capacity_ < uVar14) {
        (**buf->_vptr_buffer)(buf,uVar14);
      }
      buf->size_ = uVar14;
      memset(buf->ptr_,0x30,uVar14);
      return -precision;
    }
    if (buf->capacity_ < buf->size_ + 1) {
      (**buf->_vptr_buffer)(buf);
    }
    sVar1 = buf->size_;
    buf->size_ = sVar1 + 1;
    buf->ptr_[sVar1] = '0';
    return 0;
  }
  if ((specs._4_4_ >> 0x14 & 1) == 0) {
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
    return iVar12;
  }
  local_8c = 0;
  local_88 = buf;
  local_68 = value;
  if (precision == -1) {
    local_60.f = 0;
    local_60.e = 0;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      bVar27 = fp::assign_with_boundaries<double>(&local_60,value);
    }
    else {
      bVar27 = fp::assign_float_with_boundaries<double>(&local_60,value);
    }
    if ((local_60.f & 0x10000000000000) == 0) {
      lVar19 = 0x3f;
      if ((local_60.f & 0xfffffffffffff) != 0) {
        for (; (local_60.f & 0xfffffffffffff) >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      local_60.f = local_60.f << (~(byte)lVar19 + 0x35 & 0x3f);
      local_60.e = (local_60.e - ((uint)lVar19 ^ 0x3f)) + 0xb;
    }
    iVar12 = (int)((ulong)((long)(-0x32 - local_60.e) * 0x4d104d42 + 0xffffffff) >> 0x20);
    uVar16 = iVar12 + 0x15b;
    uVar18 = iVar12 + 0x162;
    if (-1 < (int)uVar16) {
      uVar18 = uVar16;
    }
    local_78 = (ulong)((uVar18 & 0xfffffff8) + 8);
    uVar14 = *(ulong *)(basic_data<void>::pow10_significands + (long)((int)uVar18 >> 3) * 8 + 8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar14;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_60.f << 0xb;
    local_60.f = SUB168(auVar4 * auVar8,8) - (SUB168(auVar4 * auVar8,0) >> 0x3f);
    cVar22 = (char)local_60.e;
    local_60.e = *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar18 >> 3) * 2 + 2) +
                 local_60.e + 0x35;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar14;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = bVar27.lower;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar14;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = bVar27.upper;
    lVar20 = SUB168(auVar6 * auVar10,8);
    lVar19 = -(SUB168(auVar6 * auVar10,0) >> 0x3f);
    uVar14 = lVar20 + lVar19 + 1;
    local_50.buf = buf->ptr_;
    local_50.size = 0;
    bVar15 = -(cVar22 + (char)*(short *)(basic_data<void>::pow10_exponents +
                                        (long)((int)uVar18 >> 3) * 2 + 2)) - 0x35;
    local_70 = (uint *)(1L << (bVar15 & 0x3f));
    local_50._16_8_ = uVar14 - local_60.f;
    local_80 = (long)local_70 - 1;
    uVar25 = local_80 & uVar14;
    uVar14 = uVar14 >> (bVar15 & 0x3f);
    uVar16 = (uint)uVar14 | 1;
    uVar18 = 0x1f;
    if (uVar16 != 0) {
      for (; uVar16 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar18 = (uVar18 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    uVar26 = ((SUB168(auVar5 * auVar9,0) >> 0x3f) - SUB168(auVar5 * auVar9,8)) + 2 + lVar20 + lVar19
    ;
    local_8c = (uVar18 + 1) -
               (uint)((uint)uVar14 <
                     *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar18 * 4));
    do {
      lVar19 = (long)local_8c;
      switch(local_8c) {
      case 1:
        cVar22 = (char)uVar14;
        uVar14 = 0;
        goto LAB_00178d5f;
      case 2:
        cVar22 = (char)((uVar14 & 0xffffffff) / 10);
        iVar12 = (int)((uVar14 & 0xffffffff) / 10) * 10;
        break;
      case 3:
        cVar22 = (char)((uVar14 & 0xffffffff) / 100);
        iVar12 = (int)((uVar14 & 0xffffffff) / 100) * 100;
        break;
      case 4:
        cVar22 = (char)((uVar14 & 0xffffffff) / 1000);
        iVar12 = (int)((uVar14 & 0xffffffff) / 1000) * 1000;
        break;
      case 5:
        cVar22 = (char)((uVar14 & 0xffffffff) / 10000);
        iVar12 = (int)((uVar14 & 0xffffffff) / 10000) * 10000;
        break;
      case 6:
        uVar17 = uVar14 >> 5 & 0x7ffffff;
        cVar22 = (char)(uVar17 / 0xc35);
        iVar12 = (int)(uVar17 / 0xc35) * 100000;
        break;
      case 7:
        cVar22 = (char)((uVar14 & 0xffffffff) / 1000000);
        iVar12 = (int)((uVar14 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 8:
        cVar22 = (char)((uVar14 & 0xffffffff) / 10000000);
        iVar12 = (int)((uVar14 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 9:
        cVar22 = (char)((uVar14 & 0xffffffff) / 100000000);
        iVar12 = (int)((uVar14 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 10:
        uVar17 = (uVar14 >> 9 & 0x7fffff) * 0x44b83;
        cVar22 = (char)(uVar17 >> 0x27);
        iVar12 = (uint)(uVar17 >> 0x27) * 1000000000;
        break;
      default:
        cVar22 = '\0';
        goto LAB_00178d5f;
      }
      uVar14 = (ulong)(uint)((int)uVar14 - iVar12);
LAB_00178d5f:
      local_8c = local_8c + -1;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_50,cVar22 + '0',
                          *(long *)("N3fmt2v612format_errorE" + lVar19 * 8 + 0x10) <<
                          (bVar15 & 0x3f),((uVar14 & 0xffffffff) << (bVar15 & 0x3f)) + uVar25,uVar26
                          ,local_8c,true);
      divisor = local_70;
      puVar21 = &switchD_00178c83::switchdataD_0019e908;
      if (rVar13 != more) goto LAB_00178e18;
    } while (0 < local_8c);
    do {
      uVar14 = uVar25 * 10;
      uVar26 = uVar26 * 10;
      uVar25 = uVar14 & local_80;
      local_8c = local_8c + -1;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_50,
                          (char)(uVar14 >> (bVar15 & 0x3f)) + '0',(uint64_t)divisor,uVar25,uVar26,
                          local_8c,false);
      puVar21 = divisor;
    } while (rVar13 == more);
LAB_00178e18:
    pbVar11 = local_88;
    iVar12 = (int)puVar21;
    uVar14 = (ulong)(uint)local_50.size;
    iVar24 = (int)local_78;
    if (rVar13 == error) {
      local_8c = local_8c + (local_50.size - iVar24) + 0x15b;
      fallback_format<double>(local_68,local_88,&local_8c);
      iVar12 = local_8c;
    }
    else {
      if (local_88->capacity_ < uVar14) {
        (**local_88->_vptr_buffer)(local_88,uVar14);
      }
      pbVar11->size_ = uVar14;
    }
    if (rVar13 == error) {
      return iVar12;
    }
  }
  else {
    if (0x11 < precision) {
      iVar12 = snprintf_float<double>(value,precision,specs,buf);
      return iVar12;
    }
    uVar17 = (ulong)value & 0xfffffffffffff;
    uVar18 = (uint)((ulong)value >> 0x34) & 0x7ff;
    uVar14 = uVar17 + 0x10000000000000;
    if (uVar18 == 0) {
      uVar14 = uVar17;
    }
    iVar12 = uVar18 - 0x433;
    if (uVar18 == 0) {
      lVar19 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      uVar14 = uVar14 << (~(byte)lVar19 + 0x35 & 0x3f);
      iVar12 = -0x427 - ((uint)lVar19 ^ 0x3f);
    }
    iVar24 = (int)((ulong)((long)(-0x32 - iVar12) * 0x4d104d42 + 0xffffffff) >> 0x20);
    uVar16 = iVar24 + 0x15b;
    uVar18 = iVar24 + 0x162;
    if (-1 < (int)uVar16) {
      uVar18 = uVar16;
    }
    local_78 = (ulong)(uVar18 & 0xfffffff8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar14 << 0xb;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(basic_data<void>::pow10_significands +
                             (long)((int)uVar18 >> 3) * 8 + 8);
    uVar17 = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
    uVar16 = -(*(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar18 >> 3) * 2 + 2) +
              iVar12) - 0x35;
    local_80 = (ulong)uVar16;
    local_50.buf = buf->ptr_;
    local_50.size = 0;
    local_50.fixed = uVar25 == 0x200000000;
    local_50.exp10 = 0x154 - (uVar18 & 0xfffffff8);
    bVar15 = (byte)uVar16;
    uVar26 = 1L << (bVar15 & 0x3f);
    uVar14 = uVar17 >> (bVar15 & 0x3f);
    uVar16 = (uint)uVar14 | 1;
    uVar18 = 0x1f;
    if (uVar16 != 0) {
      for (; uVar16 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar18 = (uVar18 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    iVar12 = uVar18 - ((uint)uVar14 <
                      *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar18 * 4));
    local_8c = iVar12 + 1;
    local_50.precision = precision;
    local_38 = specs;
    rVar13 = fixed_handler::on_start
                       (&local_50,(&basic_data<void>::powers_of_10_64)[iVar12] << (bVar15 & 0x3f),
                        uVar17 / 10,10,&local_8c);
    if (rVar13 == more) {
      local_70 = (uint *)(uVar26 - 1);
      uVar17 = uVar17 & (ulong)local_70;
      do {
        lVar19 = (long)local_8c;
        switch(local_8c) {
        case 1:
          cVar22 = (char)uVar14;
          uVar14 = 0;
          goto LAB_00178a26;
        case 2:
          cVar22 = (char)((uVar14 & 0xffffffff) / 10);
          iVar12 = (int)((uVar14 & 0xffffffff) / 10) * 10;
          break;
        case 3:
          cVar22 = (char)((uVar14 & 0xffffffff) / 100);
          iVar12 = (int)((uVar14 & 0xffffffff) / 100) * 100;
          break;
        case 4:
          cVar22 = (char)((uVar14 & 0xffffffff) / 1000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 1000) * 1000;
          break;
        case 5:
          cVar22 = (char)((uVar14 & 0xffffffff) / 10000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 10000) * 10000;
          break;
        case 6:
          uVar23 = uVar14 >> 5 & 0x7ffffff;
          cVar22 = (char)(uVar23 / 0xc35);
          iVar12 = (int)(uVar23 / 0xc35) * 100000;
          break;
        case 7:
          cVar22 = (char)((uVar14 & 0xffffffff) / 1000000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 1000000) * 1000000;
          break;
        case 8:
          cVar22 = (char)((uVar14 & 0xffffffff) / 10000000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 10000000) * 10000000;
          break;
        case 9:
          cVar22 = (char)((uVar14 & 0xffffffff) / 100000000);
          iVar12 = (int)((uVar14 & 0xffffffff) / 100000000) * 100000000;
          break;
        case 10:
          uVar23 = (uVar14 >> 9 & 0x7fffff) * 0x44b83;
          cVar22 = (char)(uVar23 >> 0x27);
          iVar12 = (uint)(uVar23 >> 0x27) * 1000000000;
          break;
        default:
          cVar22 = '\0';
          goto LAB_00178a26;
        }
        uVar14 = (ulong)(uint)((int)uVar14 - iVar12);
LAB_00178a26:
        local_8c = local_8c + -1;
        rVar13 = fixed_handler::on_digit
                           (&local_50,cVar22 + '0',
                            *(long *)("N3fmt2v612format_errorE" + lVar19 * 8 + 0x10) <<
                            ((byte)local_80 & 0x3f),
                            ((uVar14 & 0xffffffff) << ((byte)local_80 & 0x3f)) + uVar17,1,local_8c,
                            true);
        if (rVar13 != more) goto LAB_00178ad3;
      } while (0 < local_8c);
      error = 1;
      do {
        uVar14 = uVar17 * 10;
        error = error * 10;
        uVar17 = uVar14 & (ulong)local_70;
        local_8c = local_8c + -1;
        rVar13 = fixed_handler::on_digit
                           (&local_50,(char)(uVar14 >> ((byte)local_80 & 0x3f)) + '0',uVar26,uVar17,
                            error,local_8c,false);
      } while (rVar13 == more);
    }
LAB_00178ad3:
    pbVar11 = local_88;
    if (rVar13 == error) {
      precision = snprintf_float<double>(local_68,precision,local_38,local_88);
    }
    else {
      uVar14 = (ulong)(uint)local_50.size;
      if (0 < local_50.size && uVar25 != 0x200000000) {
        uVar14 = (ulong)(uint)local_50.size;
        do {
          iVar12 = local_8c + 1;
          if (local_88->ptr_[uVar14 - 1] != '0') goto LAB_00178ec8;
          bVar2 = 1 < (long)uVar14;
          uVar14 = uVar14 - 1;
          local_8c = iVar12;
        } while (bVar2);
        uVar14 = 0;
      }
LAB_00178ec8:
      uVar14 = uVar14 & 0xffffffff;
      if (local_88->capacity_ < uVar14) {
        (**local_88->_vptr_buffer)(local_88,uVar14);
      }
      pbVar11->size_ = uVar14;
    }
    if (rVar13 == error) {
      return precision;
    }
    iVar24 = (int)local_78 + 8;
  }
  return (local_8c - iVar24) + 0x15c;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>(), "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision != -1) {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  } else {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  }
  return exp - cached_exp10;
}